

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

int Lodtalk::ScriptContext::stExecuteFileNamed(InterpreterProxy *interpreter)

{
  Oop object;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Oop object_00;
  string basePathString;
  string fileNameString;
  string fullFileName;
  string local_88;
  string local_68;
  string local_48;
  undefined4 extraout_var_02;
  
  iVar1 = (**interpreter->_vptr_InterpreterProxy)();
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])(interpreter);
  if (CONCAT44(extraout_var_00,iVar2) == 1) {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
    object_00.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    object_00.field_0.uintValue._4_4_ = extraout_var_02;
    if (object_00.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
      std::__cxx11::string::string
                ((string *)&local_88,"expected a file name.",(allocator *)&local_68);
      nativeError(&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    object.field_0 =
         (anon_union_8_4_0eb573b0_for_Oop_0)
         ((anon_union_8_4_0eb573b0_for_Oop_0 *)(CONCAT44(extraout_var_01,iVar2) + 0x20))->pointer;
    if (object.field_0 != (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
      VMContext::getByteStringData_abi_cxx11_
                (&local_68,(VMContext *)CONCAT44(extraout_var,iVar1),object);
      std::__cxx11::string::operator=((string *)&local_88,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    VMContext::getByteStringData_abi_cxx11_
              (&local_68,(VMContext *)CONCAT44(extraout_var,iVar1),object_00);
    joinPath(&local_48,&local_88,&local_68);
    (*interpreter->_vptr_InterpreterProxy[1])(interpreter,&NilObject);
    iVar1 = executeScriptFromFileNamed(interpreter,&local_48);
    if (iVar1 == 0) {
      iVar1 = (*interpreter->_vptr_InterpreterProxy[0x11])(interpreter);
    }
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar1;
}

Assistant:

int ScriptContext::stExecuteFileNamed(InterpreterProxy *interpreter)
{
    auto context = interpreter->getContext();
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();
    auto self = reinterpret_cast<ScriptContext*> (interpreter->getReceiver().pointer);

    auto fileNameOop = interpreter->getTemporary(0);
	if(fileNameOop.isNil())
		nativeError("expected a file name.");

    std::string basePathString;
	if(!self->basePath.isNil())
		basePathString = context->getByteStringData(self->basePath);
	std::string fileNameString = context->getByteStringData(fileNameOop);
	std::string fullFileName = joinPath(basePathString, fileNameString);

    interpreter->pushOop(Oop());
	auto res = executeScriptFromFileNamed(interpreter, fullFileName);
    if(res != 0)
        return res;
    return interpreter->returnTop();
}